

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryNamesPerDir_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  bool bVar1;
  pointer pbVar2;
  Name *pNVar3;
  pointer name;
  pointer pbVar4;
  cmFindLibraryHelper helper;
  cmFindLibraryHelper cStack_108;
  
  cmFindLibraryHelper::cmFindLibraryHelper
            (&cStack_108,(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
  pbVar4 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (this->super_cmFindBase).Names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmFindLibraryHelper::AddName(&cStack_108,pbVar4);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (this->super_cmFindBase).Names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pbVar4 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar3 = cStack_108.Names.
           super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    do {
      name = cStack_108.Names.
             super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
             ._M_impl.super__Vector_impl_data._M_start;
      if (cStack_108.Names.
          super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>.
          _M_impl.super__Vector_impl_data._M_start != pNVar3) {
        do {
          bVar1 = cmFindLibraryHelper::CheckDirectoryForName(&cStack_108,pbVar4,name);
          if (bVar1) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,cStack_108.BestPath._M_dataplus._M_p,
                       cStack_108.BestPath._M_dataplus._M_p + cStack_108.BestPath._M_string_length);
            goto LAB_00280ec7;
          }
          pNVar3 = name + 1;
          name = pNVar3;
        } while (pNVar3 != cStack_108.Names.
                           super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        pbVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_00280ec7:
  cmFindLibraryHelper::~cmFindLibraryHelper(&cStack_108);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryNamesPerDir()
{
  // Search for all names in each directory.
  cmFindLibraryHelper helper(this->Makefile);
  for(std::vector<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end() ; ++ni)
    {
    helper.AddName(*ni);
    }
  // Search every directory.
  for(std::vector<std::string>::const_iterator
        p = this->SearchPaths.begin(); p != this->SearchPaths.end(); ++p)
    {
    if(helper.CheckDirectory(*p))
      {
      return helper.BestPath;
      }
    }
  // Couldn't find the library.
  return "";
}